

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void DivisionHelper<char,unsigned_short,4>::
     DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (char *t,unsigned_short *u,char *result)

{
  char cVar1;
  
  if (*u != 0) {
    if (*t == '\0') {
      cVar1 = '\0';
    }
    else {
      cVar1 = (char)((int)*t / (int)(uint)*u);
    }
    *result = cVar1;
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if( u == 0 )
        {
            E::SafeIntOnDivZero();
        }

        if( t == 0 )
        {
            result = 0;
            return;
        }

        result = (T)( t/u );
    }